

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgidm(fitsfile *fptr,int *naxis,int *status)

{
  int iVar1;
  int *status_local;
  int *naxis_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (fptr->Fptr->hdutype == 0) {
      *naxis = fptr->Fptr->imgdim;
    }
    else if (fptr->Fptr->compressimg == 0) {
      *status = 0xe9;
    }
    else {
      *naxis = fptr->Fptr->zndim;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgidm( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *naxis  ,   /* O - image dimension (NAXIS value)           */
            int  *status)    /* IO - error status                           */
/*
  Get the dimension of the image (= NAXIS keyword for normal image, or
  ZNAXIS for a compressed image)
  These values are cached for faster access.
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        *naxis = (fptr->Fptr)->imgdim;
    }
    else if ((fptr->Fptr)->compressimg)
    {
        *naxis = (fptr->Fptr)->zndim;
    }
    else
    {
        *status = NOT_IMAGE;
    }

    return(*status);
}